

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_errors.h
# Opt level: O1

void __thiscall booster::locale::conv::conversion_error::conversion_error(conversion_error *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Conversion failed","");
  runtime_error::runtime_error(&this->super_runtime_error,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  *(undefined ***)&this->super_runtime_error = &PTR__runtime_error_001d0680;
  (this->super_runtime_error).super_backtrace._vptr_backtrace =
       (_func_int **)&PTR__conversion_error_001d06a8;
  return;
}

Assistant:

conversion_error() : booster::runtime_error("Conversion failed") {}